

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

uchar * tjLoadImage(char *filename,int *width,int align,int *height,int *pixelFormat,int flags)

{
  JDIMENSION JVar1;
  JSAMPARRAY ppJVar2;
  bool bVar3;
  int iVar4;
  JDIMENSION JVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  j_compress_ptr cinfo;
  j_compress_ptr __stream;
  int *piVar9;
  char *pcVar10;
  cjpeg_source_ptr pcVar11;
  long lVar12;
  j_compress_ptr __ptr;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  
  auVar16._0_4_ = -(uint)(filename == (char *)0x0);
  auVar16._4_4_ = -(uint)(width == (int *)0x0);
  auVar16._8_4_ = -(uint)(height == (int *)0x0);
  auVar16._12_4_ = -(uint)(pixelFormat == (int *)0x0);
  iVar14 = movmskps((int)height,auVar16);
  if ((iVar14 == 0 && 0 < align) && (0xfffffff2 < *pixelFormat - 0xcU)) {
    if ((align & align - 1U) == 0) {
      cinfo = (j_compress_ptr)tjInitCompress();
      if (cinfo == (j_compress_ptr)0x0) {
        return (uchar *)0x0;
      }
      __stream = (j_compress_ptr)fopen(filename,"rb");
      if (__stream == (j_compress_ptr)0x0) {
        pcVar8 = (char *)__tls_get_addr(&PTR_0019df20);
        piVar9 = __errno_location();
        pcVar10 = strerror(*piVar9);
        snprintf(pcVar8,200,"%s\n%s","tjLoadImage(): Cannot open input file",pcVar10);
        __stream = (j_compress_ptr)0x0;
      }
      else {
        iVar14 = getc((FILE *)__stream);
        if ((-1 < iVar14) && (iVar4 = ungetc(iVar14,(FILE *)__stream), iVar4 != -1)) {
          iVar4 = _setjmp((__jmp_buf_tag *)&cinfo[2].restart_interval);
          __ptr = (j_compress_ptr)0x0;
          if (iVar4 != 0) {
            bVar3 = true;
            goto LAB_0013c2bb;
          }
          if ((long)*pixelFormat != -1) {
            __ptr = (j_compress_ptr)(ulong)pf2cs[*pixelFormat];
          }
          cinfo->in_color_space = (J_COLOR_SPACE)__ptr;
          if (iVar14 == 0x50) {
            pcVar11 = jinit_read_ppm(cinfo);
            if (pcVar11 != (cjpeg_source_ptr)0x0) {
              uVar15 = (uint)flags >> 1 & 1;
              goto LAB_0013c4da;
            }
LAB_0013c5bd:
            pcVar8 = (char *)__tls_get_addr(&PTR_0019df20);
            builtin_strncpy(pcVar8,"tjLoadImage(): Could not initialize bitmap loader",0x32);
LAB_0013c603:
            __ptr = (j_compress_ptr)0x0;
          }
          else {
            if (iVar14 != 0x42) {
              pcVar8 = (char *)__tls_get_addr(&PTR_0019df20);
              builtin_strncpy(pcVar8,"tjLoadImage(): Unsupported file type",0x25);
              goto LAB_0013c603;
            }
            pcVar11 = jinit_read_bmp(cinfo,0);
            if (pcVar11 == (cjpeg_source_ptr)0x0) goto LAB_0013c5bd;
            uVar15 = (uint)((flags & 2U) == 0);
LAB_0013c4da:
            pcVar11->input_file = (FILE *)__stream;
            (*pcVar11->start_input)(cinfo,pcVar11);
            (*cinfo->mem->realize_virt_arrays)((j_common_ptr)cinfo);
            *width = cinfo->image_width;
            *height = cinfo->image_height;
            iVar14 = cs2pf[cinfo->in_color_space];
            *pixelFormat = iVar14;
            lVar12 = (long)(int)(-align & (tjPixelSize[iVar14] * *width + align) - 1U);
            __ptr = (j_compress_ptr)malloc(*height * lVar12);
            if (__ptr == (j_compress_ptr)0x0) {
              pcVar8 = (char *)__tls_get_addr(&PTR_0019df20);
              builtin_strncpy(pcVar8,"tjLoadImage(): Memory allocation failure",0x29);
              __ptr = (j_compress_ptr)0x0;
            }
            else {
              iVar14 = _setjmp((__jmp_buf_tag *)&cinfo[2].restart_interval);
              if (iVar14 == 0) {
                uVar7 = cinfo->next_scanline;
                while (uVar7 < cinfo->image_height) {
                  JVar5 = (*pcVar11->get_pixel_rows)(cinfo,pcVar11);
                  if (0 < (int)JVar5) {
                    JVar1 = cinfo->next_scanline;
                    ppJVar2 = pcVar11->buffer;
                    iVar14 = *width;
                    iVar4 = tjPixelSize[*pixelFormat];
                    uVar13 = 0;
                    do {
                      if (uVar15 == 0) {
                        iVar6 = JVar1 + (int)uVar13;
                      }
                      else {
                        iVar6 = ~((int)uVar13 + JVar1) + *height;
                      }
                      memcpy((void *)((long)__ptr->quant_tbl_ptrs + iVar6 * lVar12 + -0x60),
                             ppJVar2[uVar13],(long)iVar4 * (long)iVar14);
                      uVar13 = uVar13 + 1;
                    } while (JVar5 != uVar13);
                  }
                  uVar7 = JVar5 + cinfo->next_scanline;
                  cinfo->next_scanline = uVar7;
                }
                (*pcVar11->finish_input)(cinfo,pcVar11);
                bVar3 = false;
                goto LAB_0013c2bb;
              }
            }
          }
          bVar3 = true;
          goto LAB_0013c2bb;
        }
        pcVar8 = (char *)__tls_get_addr(&PTR_0019df20);
        piVar9 = __errno_location();
        pcVar10 = strerror(*piVar9);
        snprintf(pcVar8,200,"%s\n%s","tjLoadImage(): Could not read input file",pcVar10);
      }
      __ptr = (j_compress_ptr)0x0;
      bVar3 = true;
      goto LAB_0013c2bb;
    }
    pcVar8 = (char *)__tls_get_addr(&PTR_0019df20);
    builtin_strncpy(pcVar8 + 0x10,"lignment must be a power of 2",0x1e);
    uVar17._0_1_ = 'a';
    uVar17._1_1_ = 'g';
    uVar17._2_1_ = 'e';
    uVar17._3_1_ = '(';
    uVar17._4_1_ = ')';
    uVar17._5_1_ = ':';
    uVar17._6_1_ = ' ';
    uVar17._7_1_ = 'A';
  }
  else {
    pcVar8 = (char *)__tls_get_addr(&PTR_0019df20);
    builtin_strncpy(pcVar8 + 0x10,"nvalid argument",0x10);
    uVar17._0_1_ = 'a';
    uVar17._1_1_ = 'g';
    uVar17._2_1_ = 'e';
    uVar17._3_1_ = '(';
    uVar17._4_1_ = ')';
    uVar17._5_1_ = ':';
    uVar17._6_1_ = ' ';
    uVar17._7_1_ = 'I';
  }
  pcVar8[0] = 't';
  pcVar8[1] = 'j';
  pcVar8[2] = 'L';
  pcVar8[3] = 'o';
  pcVar8[4] = 'a';
  pcVar8[5] = 'd';
  pcVar8[6] = 'I';
  pcVar8[7] = 'm';
  *(undefined8 *)(pcVar8 + 8) = uVar17;
  bVar3 = true;
  __ptr = (j_compress_ptr)0x0;
  cinfo = __ptr;
  __stream = __ptr;
LAB_0013c2bb:
  if (cinfo != (j_compress_ptr)0x0) {
    tjDestroy(cinfo);
  }
  if (__stream != (j_compress_ptr)0x0) {
    fclose((FILE *)__stream);
  }
  if (bVar3) {
    free(__ptr);
    return (uchar *)0x0;
  }
  return (uchar *)__ptr;
}

Assistant:

DLLEXPORT unsigned char *tjLoadImage(const char *filename, int *width,
                                     int align, int *height, int *pixelFormat,
                                     int flags)
{
  int retval = 0, tempc;
  size_t pitch;
  tjhandle handle = NULL;
  tjinstance *this;
  j_compress_ptr cinfo = NULL;
  cjpeg_source_ptr src;
  unsigned char *dstBuf = NULL;
  FILE *file = NULL;
  boolean invert;

  if (!filename || !width || align < 1 || !height || !pixelFormat ||
      *pixelFormat < TJPF_UNKNOWN || *pixelFormat >= TJ_NUMPF)
    THROWG("tjLoadImage(): Invalid argument");
  if ((align & (align - 1)) != 0)
    THROWG("tjLoadImage(): Alignment must be a power of 2");

  if ((handle = tjInitCompress()) == NULL) return NULL;
  this = (tjinstance *)handle;
  cinfo = &this->cinfo;

  if ((file = fopen(filename, "rb")) == NULL)
    THROW_UNIX("tjLoadImage(): Cannot open input file");

  if ((tempc = getc(file)) < 0 || ungetc(tempc, file) == EOF)
    THROW_UNIX("tjLoadImage(): Could not read input file")
  else if (tempc == EOF)
    THROWG("tjLoadImage(): Input file contains no data");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (*pixelFormat == TJPF_UNKNOWN) cinfo->in_color_space = JCS_UNKNOWN;
  else cinfo->in_color_space = pf2cs[*pixelFormat];
  if (tempc == 'B') {
    if ((src = jinit_read_bmp(cinfo, FALSE)) == NULL)
      THROWG("tjLoadImage(): Could not initialize bitmap loader");
    invert = (flags & TJFLAG_BOTTOMUP) == 0;
  } else if (tempc == 'P') {
    if ((src = jinit_read_ppm(cinfo)) == NULL)
      THROWG("tjLoadImage(): Could not initialize bitmap loader");
    invert = (flags & TJFLAG_BOTTOMUP) != 0;
  } else
    THROWG("tjLoadImage(): Unsupported file type");

  src->input_file = file;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  /* Refuse to load images larger than 1 Megapixel when fuzzing. */
  if (flags & TJFLAG_FUZZING)
    src->max_pixels = 1048576;
#endif
  (*src->start_input) (cinfo, src);
  (*cinfo->mem->realize_virt_arrays) ((j_common_ptr)cinfo);

  *width = cinfo->image_width;  *height = cinfo->image_height;
  *pixelFormat = cs2pf[cinfo->in_color_space];

  pitch = PAD((*width) * tjPixelSize[*pixelFormat], align);
  if ((unsigned long long)pitch * (unsigned long long)(*height) >
      (unsigned long long)((size_t)-1) ||
      (dstBuf = (unsigned char *)malloc(pitch * (*height))) == NULL)
    THROWG("tjLoadImage(): Memory allocation failure");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  while (cinfo->next_scanline < cinfo->image_height) {
    int i, nlines = (*src->get_pixel_rows) (cinfo, src);

    for (i = 0; i < nlines; i++) {
      unsigned char *dstptr;
      int row;

      row = cinfo->next_scanline + i;
      if (invert) dstptr = &dstBuf[((*height) - row - 1) * pitch];
      else dstptr = &dstBuf[row * pitch];
      memcpy(dstptr, src->buffer[i], (*width) * tjPixelSize[*pixelFormat]);
    }
    cinfo->next_scanline += nlines;
  }

  (*src->finish_input) (cinfo, src);

bailout:
  if (handle) tjDestroy(handle);
  if (file) fclose(file);
  if (retval < 0) { free(dstBuf);  dstBuf = NULL; }
  return dstBuf;
}